

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::ParseNoReflection(internal *this,string_view from,MessageLite *to)

{
  undefined1 uVar1;
  bool bVar2;
  MessageLite *this_00;
  long in_FS_OFFSET;
  char *ptr;
  ParseContext ctx;
  char *local_98;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  ParseContext local_80;
  
  this_00 = (MessageLite *)from._M_str;
  local_90._M_str = (char *)from._M_len;
  uVar1 = *(undefined1 *)(in_FS_OFFSET + -0x60);
  *(undefined1 *)(in_FS_OFFSET + -0x60) = 0;
  local_90._M_len = (size_t)this;
  (*this_00->_vptr_MessageLite[2])(this_00);
  ParseContext::ParseContext<std::basic_string_view<char,std::char_traits<char>>&>
            (&local_80,io::CodedInputStream::default_recursion_limit_,false,&local_98,&local_90);
  local_98 = MessageLite::_InternalParse(this_00,local_98,&local_80);
  bVar2 = false;
  if ((local_98 != (char *)0x0) &&
     (bVar2 = false, local_80.super_EpsCopyInputStream.last_tag_minus_1_ == 0)) {
    bVar2 = MessageLite::IsInitializedWithErrors(this_00);
  }
  *(undefined1 *)(in_FS_OFFSET + -0x60) = uVar1;
  return bVar2;
}

Assistant:

bool ParseNoReflection(absl::string_view from, google::protobuf::MessageLite& to) {
  auto cleanup = DisableTracking();

  to.Clear();
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             false, &ptr, from);
  ptr = to._InternalParse(ptr, &ctx);
  if (ptr == nullptr || !ctx.EndedAtLimit()) return false;
  return to.IsInitializedWithErrors();
}